

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ApproxQuantileState,duckdb::list_entry_t,duckdb::ApproxQuantileListOperation<short>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *finalize_data_00;
  ApproxQuantileState *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  list_entry_t *in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  list_entry_t *rdata_1;
  ApproxQuantileState **sdata_1;
  AggregateFinalizeData finalize_data;
  list_entry_t *rdata;
  ApproxQuantileState **sdata;
  ApproxQuantileState *local_80;
  AggregateFinalizeData local_78;
  list_entry_t *local_60;
  ApproxQuantileState **local_58;
  AggregateFinalizeData local_50;
  list_entry_t *local_38;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    finalize_data_00 =
         (AggregateFinalizeData *)
         ConstantVector::GetData<duckdb::ApproxQuantileState*>((Vector *)0xaed430);
    local_38 = ConstantVector::GetData<duckdb::list_entry_t>((Vector *)0xaed43f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,in_RDX,in_RSI);
    ApproxQuantileListOperation<short>::Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
              (in_RCX,in_R8,finalize_data_00);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    local_58 = FlatVector::GetData<duckdb::ApproxQuantileState*>((Vector *)0xaed48d);
    local_60 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xaed49c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = (ApproxQuantileState *)0x0; local_80 < in_RCX;
        local_80 = (ApproxQuantileState *)((long)&local_80->h + 1)) {
      local_78.result_idx = (long)&in_R8->offset + (long)&local_80->h;
      ApproxQuantileListOperation<short>::Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
                (in_RCX,in_R8,in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}